

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O2

void __thiscall gnilk::LogManager::IterateLogs(LogManager *this,LogDelegate *cbInstance)

{
  __node_base *p_Var1;
  __shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2> local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>
  local_60;
  
  std::mutex::lock(&this->instLock);
  p_Var1 = &(this->logInstances)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>
    ::pair(&local_60,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>
            *)(p_Var1 + 1));
    std::__shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_70,
               &((local_60.second.super___shared_ptr<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->logger).super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>);
    std::function<bool_(const_std::shared_ptr<gnilk::Log>_&)>::operator()
              (cbInstance,(shared_ptr<gnilk::Log> *)&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>
    ::~pair(&local_60);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->instLock);
  return;
}

Assistant:

void LogManager::IterateLogs(const LogDelegate &cbInstance) {
    std::lock_guard<std::mutex> lock(instLock);
    for(auto [name, inst] : logInstances) {
        cbInstance(inst->GetLog());
    }
}